

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  ImVec2 IVar3;
  ImGuiWindow *pIVar5;
  ImVec2 IVar6;
  ImGuiShrinkWidthItem *pIVar7;
  ImGuiID IVar8;
  ImGuiID IVar9;
  ImGuiID IVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  ImGuiContext *pIVar15;
  ImGuiContext *pIVar16;
  undefined4 uVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  int section_n;
  int iVar21;
  ImGuiID IVar22;
  uint uVar23;
  int iVar24;
  ImGuiTabItem *__dest;
  ImGuiShrinkWidthItem *__dest_00;
  char *__dest_01;
  long lVar25;
  long lVar26;
  char *pcVar27;
  ImGuiID IVar28;
  int iVar29;
  uint uVar30;
  ImGuiTabItem *pIVar31;
  ulong uVar32;
  uint uVar33;
  ulong uVar34;
  byte bVar35;
  uint uVar36;
  ImGuiID *pIVar37;
  ImGuiID *pIVar38;
  long lVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  ImGuiTabBarSection sections [3];
  int shrink_buffer_indexes [3];
  ImVec4 arrow_col;
  ImGuiID *local_120;
  float local_114;
  undefined8 local_100;
  float local_f8 [3];
  uint uStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined1 local_c8 [16];
  int local_ac [2];
  float local_a4;
  ImVec2 local_a0;
  undefined1 local_98 [8];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  ImVec4 local_78;
  undefined8 local_60;
  ImVec4 local_58;
  undefined1 local_48 [16];
  
  pIVar16 = GImGui;
  tab_bar->WantLayout = false;
  local_e8 = 0;
  uStack_e0 = 0;
  local_f8[0] = 0.0;
  local_f8[1] = 0.0;
  stack0xffffffffffffff10 = 0;
  local_d8 = 0;
  uVar36 = (tab_bar->Tabs).Size;
  if ((int)uVar36 < 1) {
    bVar35 = 0;
    uVar23 = 0;
  }
  else {
    pIVar31 = (tab_bar->Tabs).Data;
    lVar25 = 0;
    uVar32 = 0;
    uVar23 = 0;
    bVar35 = 0;
    do {
      pIVar37 = (ImGuiID *)((long)&pIVar31->ID + lVar25);
      if ((*(int *)((long)&pIVar31->LastFrameVisible + lVar25) < tab_bar->PrevFrameVisible) ||
         ((&pIVar31->WantClose)[lVar25] == true)) {
        IVar28 = *pIVar37;
        if (tab_bar->VisibleTabId == IVar28) {
          tab_bar->VisibleTabId = 0;
        }
        if (tab_bar->SelectedTabId == IVar28) {
          tab_bar->SelectedTabId = 0;
        }
        if (tab_bar->NextSelectedTabId == IVar28) {
          tab_bar->NextSelectedTabId = 0;
        }
      }
      else {
        uVar34 = (ulong)uVar23;
        if (uVar32 != uVar34) {
          if (((int)uVar23 < 0) || ((int)uVar36 <= (int)uVar23)) goto LAB_00164f58;
          *(undefined4 *)((long)&pIVar31[uVar34].BeginOrder + 1) =
               *(undefined4 *)((long)pIVar37 + 0x1f);
          IVar28 = *pIVar37;
          IVar22 = pIVar37[1];
          IVar8 = pIVar37[2];
          IVar9 = pIVar37[3];
          fVar40 = (float)pIVar37[5];
          fVar43 = (float)pIVar37[6];
          IVar10 = pIVar37[7];
          pfVar1 = &pIVar31[uVar34].Offset;
          *pfVar1 = (float)pIVar37[4];
          pfVar1[1] = fVar40;
          pfVar1[2] = fVar43;
          pfVar1[3] = (float)IVar10;
          pIVar31 = pIVar31 + uVar34;
          pIVar31->ID = IVar28;
          pIVar31->Flags = IVar22;
          pIVar31->LastFrameVisible = IVar8;
          pIVar31->LastFrameSelected = IVar9;
          uVar36 = (tab_bar->Tabs).Size;
        }
        if ((int)uVar36 <= (int)uVar23) goto LAB_00164f58;
        pIVar31 = (tab_bar->Tabs).Data;
        pIVar31[uVar34].IndexDuringLayout = (ImS16)uVar23;
        uVar33 = pIVar31[uVar34].Flags;
        lVar39 = 0;
        if ((uVar33 & 0x40) == 0) {
          lVar39 = (ulong)((char)(byte)uVar33 < '\0') + 1;
        }
        if (uVar23 != 0) {
          if ((int)uVar36 < (int)uVar23) goto LAB_00164f58;
          bVar35 = (pIVar31[(long)(int)uVar23 + -1].Flags & 0x40U) == 0 & (byte)uVar33 >> 6 | bVar35
                   | ((uVar33 & 0xc0) != 0x80 &&
                     (pIVar31[(long)(int)uVar23 + -1].Flags & 0xc0U) == 0x80);
        }
        local_f8[lVar39 * 3] = (float)((int)local_f8[lVar39 * 3] + 1);
        uVar23 = uVar23 + 1;
      }
      uVar32 = uVar32 + 1;
      lVar25 = lVar25 + 0x24;
    } while ((long)uVar32 < (long)(int)uVar36);
  }
  if (uVar36 != uVar23) {
    iVar29 = (tab_bar->Tabs).Capacity;
    if (iVar29 < (int)uVar23) {
      if (iVar29 == 0) {
        uVar36 = 8;
      }
      else {
        uVar36 = iVar29 / 2 + iVar29;
      }
      if ((int)uVar36 <= (int)uVar23) {
        uVar36 = uVar23;
      }
      __dest = (ImGuiTabItem *)MemAlloc((long)(int)uVar36 * 0x24);
      pIVar31 = (tab_bar->Tabs).Data;
      if (pIVar31 != (ImGuiTabItem *)0x0) {
        memcpy(__dest,pIVar31,(long)(tab_bar->Tabs).Size * 0x24);
        MemFree((tab_bar->Tabs).Data);
      }
      (tab_bar->Tabs).Data = __dest;
      (tab_bar->Tabs).Capacity = uVar36;
    }
    (tab_bar->Tabs).Size = uVar23;
  }
  if (bVar35 != 0) {
    qsort((tab_bar->Tabs).Data,(long)(int)uVar23,0x24,TabItemComparerBySection);
  }
  fVar43 = local_f8[0];
  uVar36 = uStack_ec;
  uVar32 = (ulong)uStack_ec;
  iVar29 = (int)uStack_e0;
  fVar40 = 0.0;
  local_114 = 0.0;
  if (0 < (int)((int)uStack_e0 + uStack_ec) && 0 < (int)local_f8[0]) {
    fVar40 = (pIVar16->Style).ItemInnerSpacing.x;
  }
  stack0xffffffffffffff10 = CONCAT44(uStack_ec,fVar40);
  if (0 < (int)uStack_e0 && 0 < (int)uStack_ec) {
    local_114 = (pIVar16->Style).ItemInnerSpacing.x;
  }
  local_e8 = CONCAT44(local_114,(float)local_e8);
  IVar28 = tab_bar->NextSelectedTabId;
  if (IVar28 != 0) {
    tab_bar->SelectedTabId = IVar28;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    bVar18 = TabBarProcessReorder(tab_bar);
    if ((bVar18) && (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)) {
      IVar28 = tab_bar->ReorderRequestTabId;
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar15 = GImGui;
  local_100 = uVar32;
  if ((tab_bar->Flags & 4) != 0) {
    pIVar5 = GImGui->CurrentWindow;
    fVar41 = (GImGui->Style).FramePadding.y;
    fVar44 = GImGui->FontSize;
    IVar6 = (pIVar5->DC).CursorPos;
    fVar42 = (tab_bar->BarRect).Min.y;
    (pIVar5->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar41;
    (pIVar5->DC).CursorPos.y = fVar42;
    (tab_bar->BarRect).Min.x = fVar44 + fVar41 + (tab_bar->BarRect).Min.x;
    local_58.x = (pIVar15->Style).Colors[0].x;
    local_58.y = (pIVar15->Style).Colors[0].y;
    uVar11 = (pIVar15->Style).Colors[0].z;
    uVar12 = (pIVar15->Style).Colors[0].w;
    local_58.w = (float)uVar12 * 0.5;
    local_58.z = (float)uVar11;
    PushStyleColor(0,&local_58);
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_78.z = 0.0;
    local_78.w = 0.0;
    PushStyleColor(0x15,&local_78);
    bVar18 = BeginCombo("##v",(char *)0x0,0x50);
    PopStyleColor(2);
    if (bVar18) {
      iVar21 = (tab_bar->Tabs).Size;
      if (0 < iVar21) {
        local_c8._0_8_ = pIVar5;
        lVar25 = 0;
        lVar39 = 0;
        pIVar37 = (ImGuiID *)0x0;
        do {
          pIVar31 = (tab_bar->Tabs).Data;
          if ((*(byte *)((long)&pIVar31->Flags + lVar25 + 2) & 0x20) == 0) {
            iVar21 = (int)*(short *)((long)&pIVar31->NameOffset + lVar25);
            if ((iVar21 == -1) || ((tab_bar->TabsNames).Buf.Size <= iVar21)) goto LAB_00164f8e;
            pIVar38 = (ImGuiID *)((long)&pIVar31->ID + lVar25);
            local_78.x = 0.0;
            local_78.y = 0.0;
            bVar18 = Selectable((tab_bar->TabsNames).Buf.Data + iVar21,
                                tab_bar->SelectedTabId == *pIVar38,0,(ImVec2 *)&local_78);
            if (bVar18) {
              pIVar37 = pIVar38;
            }
            iVar21 = (tab_bar->Tabs).Size;
          }
          lVar39 = lVar39 + 1;
          lVar25 = lVar25 + 0x24;
        } while (lVar39 < iVar21);
        EndPopup();
        *(ImVec2 *)(local_c8._0_8_ + 0xd8) = IVar6;
        uVar36 = (uint)local_100;
        if (pIVar37 != (ImGuiID *)0x0) {
          IVar28 = *pIVar37;
          tab_bar->SelectedTabId = IVar28;
        }
        goto LAB_00164464;
      }
      EndPopup();
    }
    (pIVar5->DC).CursorPos = IVar6;
  }
LAB_00164464:
  local_ac[0] = 0;
  local_ac[1] = iVar29 + (int)fVar43;
  local_a4 = fVar43;
  iVar29 = (tab_bar->Tabs).Size;
  iVar21 = (pIVar16->ShrinkWidthBuffer).Capacity;
  iVar24 = iVar29;
  if (iVar21 < iVar29) {
    if (iVar21 == 0) {
      iVar21 = 8;
    }
    else {
      iVar21 = iVar21 / 2 + iVar21;
    }
    if (iVar21 <= iVar29) {
      iVar21 = iVar29;
    }
    __dest_00 = (ImGuiShrinkWidthItem *)MemAlloc((long)iVar21 << 3);
    pIVar7 = (pIVar16->ShrinkWidthBuffer).Data;
    if (pIVar7 != (ImGuiShrinkWidthItem *)0x0) {
      memcpy(__dest_00,pIVar7,(long)(pIVar16->ShrinkWidthBuffer).Size << 3);
      MemFree((pIVar16->ShrinkWidthBuffer).Data);
    }
    (pIVar16->ShrinkWidthBuffer).Data = __dest_00;
    (pIVar16->ShrinkWidthBuffer).Capacity = iVar21;
    iVar24 = (tab_bar->Tabs).Size;
    uVar36 = (uint)local_100;
  }
  (pIVar16->ShrinkWidthBuffer).Size = iVar29;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = local_c8._8_8_;
  local_c8 = auVar48 << 0x40;
  if (iVar24 < 1) {
    bVar18 = true;
    local_120 = (ImGuiID *)0x0;
  }
  else {
    lVar25 = 0;
    lVar39 = 0;
    local_120 = (ImGuiID *)0x0;
    bVar18 = false;
    iVar29 = -1;
    do {
      pIVar31 = (tab_bar->Tabs).Data;
      if (*(int *)((long)&pIVar31->LastFrameVisible + lVar25) < tab_bar->PrevFrameVisible) {
        __assert_fail("tab->LastFrameVisible >= tab_bar->PrevFrameVisible",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                      ,0x1bc3,"void ImGui::TabBarLayout(ImGuiTabBar *)");
      }
      pIVar37 = (ImGuiID *)((long)&pIVar31->ID + lVar25);
      if (((local_120 == (ImGuiID *)0x0) ||
          ((int)local_120[3] < *(int *)((long)&pIVar31->LastFrameSelected + lVar25))) &&
         ((*(byte *)((long)&pIVar31->Flags + lVar25 + 2) & 0x20) == 0)) {
        local_120 = pIVar37;
      }
      IVar22 = *pIVar37;
      if (IVar22 == tab_bar->SelectedTabId) {
        bVar18 = true;
      }
      if ((IVar28 == 0) && (IVar28 = IVar22, pIVar16->NavJustMovedToId != IVar22)) {
        IVar28 = 0;
      }
      iVar21 = (int)*(short *)((long)&pIVar31->NameOffset + lVar25);
      if ((iVar21 == -1) || ((tab_bar->TabsNames).Buf.Size <= iVar21)) {
LAB_00164f8e:
        __assert_fail("tab->NameOffset != -1 && (int)tab->NameOffset < TabsNames.Buf.Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_internal.h"
                      ,0x762,"const char *ImGuiTabBar::GetTabName(const ImGuiTabItem *) const");
      }
      IVar6 = TabItemCalcSize((tab_bar->TabsNames).Buf.Data + iVar21,
                              (*(uint *)((long)&pIVar31->Flags + lVar25) >> 0x14 & 1) == 0);
      auVar48 = local_c8;
      fVar41 = IVar6.x;
      *(float *)((long)&pIVar31->ContentWidth + lVar25) = fVar41;
      uVar36 = *(uint *)((long)&pIVar31->Flags + lVar25);
      uVar32 = (ulong)(((char)uVar36 < '\0') + 1);
      if ((uVar36 & 0x40) != 0) {
        uVar32 = 0;
      }
      fVar44 = 0.0;
      if ((int)uVar32 == iVar29) {
        fVar44 = (pIVar16->Style).ItemInnerSpacing.x;
      }
      local_f8[uVar32 * 3 + 1] = fVar44 + fVar41 + local_f8[uVar32 * 3 + 1];
      iVar29 = local_ac[uVar32];
      lVar26 = (long)iVar29;
      local_ac[uVar32] = iVar29 + 1;
      if ((lVar26 < 0) || ((pIVar16->ShrinkWidthBuffer).Size <= iVar29)) goto LAB_00164f77;
      pIVar7 = (pIVar16->ShrinkWidthBuffer).Data;
      pIVar7[lVar26].Index = (int)lVar39;
      if ((pIVar16->ShrinkWidthBuffer).Size <= iVar29) goto LAB_00164f77;
      pIVar7[lVar26].Width = fVar41;
      if (fVar41 <= 0.0) {
        __assert_fail("tab->ContentWidth > 0.0f",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_widgets.cpp"
                      ,0x1bdd,"void ImGui::TabBarLayout(ImGuiTabBar *)");
      }
      *(float *)((long)&pIVar31->Width + lVar25) = fVar41;
      lVar39 = lVar39 + 1;
      iVar21 = (tab_bar->Tabs).Size;
      lVar25 = lVar25 + 0x24;
      iVar29 = (int)uVar32;
    } while (lVar39 < iVar21);
    local_c8._1_7_ = 0;
    local_c8[0] = 1 < iVar21;
    local_c8._8_8_ = auVar48._8_8_;
    bVar18 = !bVar18;
    uVar36 = (uint)local_100;
  }
  fVar41 = 0.0;
  lVar25 = 8;
  do {
    fVar41 = fVar41 + *(float *)((long)&local_100 + lVar25 + 4) +
                      *(float *)((long)local_f8 + lVar25);
    lVar25 = lVar25 + 0xc;
  } while (lVar25 != 0x2c);
  tab_bar->WidthAllTabsIdeal = fVar41;
  pIVar15 = GImGui;
  fVar44 = (tab_bar->BarRect).Max.x;
  if (((local_c8[0] & fVar44 - (tab_bar->BarRect).Min.x < fVar41) != 0) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    pIVar5 = GImGui->CurrentWindow;
    fVar44 = GImGui->FontSize + -2.0;
    local_c8 = ZEXT416((uint)fVar44);
    fVar41 = (GImGui->Style).FramePadding.y;
    _local_98 = ZEXT416((uint)(fVar41 + fVar41 + GImGui->FontSize));
    local_88 = ZEXT416((uint)(fVar44 + fVar44));
    local_a0 = (pIVar5->DC).CursorPos;
    local_58.x = (GImGui->Style).Colors[0].x;
    local_58.y = (GImGui->Style).Colors[0].y;
    uVar13 = (GImGui->Style).Colors[0].z;
    uVar14 = (GImGui->Style).Colors[0].w;
    local_58.w = (float)uVar14 * 0.5;
    local_58.z = (float)uVar13;
    PushStyleColor(0,&local_58);
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_78.z = 0.0;
    local_78.w = 0.0;
    PushStyleColor(0x15,&local_78);
    local_60._0_4_ = (pIVar15->IO).KeyRepeatDelay;
    local_60._4_4_ = (pIVar15->IO).KeyRepeatRate;
    (pIVar15->IO).KeyRepeatDelay = 0.25;
    (pIVar15->IO).KeyRepeatRate = 0.2;
    fVar41 = (tab_bar->BarRect).Min.x;
    fVar44 = (tab_bar->BarRect).Max.x - (float)local_88._0_4_;
    uVar36 = -(uint)(fVar44 <= fVar41);
    fVar44 = (float)(uVar36 & (uint)fVar41 | ~uVar36 & (uint)fVar44);
    local_48 = ZEXT416((uint)fVar44);
    fVar41 = (tab_bar->BarRect).Min.y;
    (pIVar5->DC).CursorPos.x = fVar44;
    (pIVar5->DC).CursorPos.y = fVar41;
    uVar17 = local_98._0_4_;
    uStack_8c = local_98._4_4_;
    local_98._4_4_ = local_98._0_4_;
    local_98._0_4_ = local_c8._0_4_;
    uStack_90 = local_c8._4_4_;
    IVar6.y = (float)uVar17;
    IVar6.x = (float)local_c8._0_4_;
    bVar19 = ArrowButtonEx("##<",0,IVar6,0x410);
    fVar41 = (tab_bar->BarRect).Min.y;
    (pIVar5->DC).CursorPos.x = (float)local_48._0_4_ + (float)local_c8._0_4_;
    (pIVar5->DC).CursorPos.y = fVar41;
    bVar20 = ArrowButtonEx("##>",1,(ImVec2)local_98,0x410);
    iVar29 = -(uint)bVar19;
    if (bVar20) {
      iVar29 = 1;
    }
    PopStyleColor(2);
    (pIVar15->IO).KeyRepeatDelay = (float)(undefined4)local_60;
    (pIVar15->IO).KeyRepeatRate = (float)local_60._4_4_;
    if (((iVar29 != 0) && (tab_bar->SelectedTabId != 0)) &&
       (lVar25 = (long)(tab_bar->Tabs).Size, 0 < lVar25)) {
      pIVar31 = (tab_bar->Tabs).Data;
      do {
        if (pIVar31->ID == tab_bar->SelectedTabId) {
          uVar23 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar31);
          iVar21 = (tab_bar->Tabs).Size;
          uVar36 = (uint)local_100;
          goto LAB_00164ed9;
        }
        pIVar31 = pIVar31 + 1;
        lVar25 = lVar25 + -1;
      } while (lVar25 != 0);
    }
    (pIVar5->DC).CursorPos = local_a0;
    fVar44 = (tab_bar->BarRect).Max.x - ((float)local_88._0_4_ + 1.0);
    (tab_bar->BarRect).Max.x = fVar44;
    uVar36 = (uint)local_100;
  }
  goto LAB_0016492e;
LAB_00164f77:
  pcVar27 = "T &ImVector<ImGuiShrinkWidthItem>::operator[](int) [T = ImGuiShrinkWidthItem]";
  goto LAB_00164f6d;
LAB_00164f58:
  pcVar27 = "T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]";
LAB_00164f6d:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.h"
                ,0x658,pcVar27);
  while( true ) {
    pIVar31 = (tab_bar->Tabs).Data;
    if (((pIVar31[uVar33].Flags & 0x200000) == 0) ||
       ((iVar24 = uVar23 + iVar29 * 2, iVar24 < 0 || (uVar23 = uVar30, iVar21 <= iVar24)))) break;
LAB_00164ed9:
    uVar30 = iVar29 + uVar23;
    uVar33 = uVar23;
    if ((int)uVar30 < iVar21) {
      uVar33 = uVar30;
    }
    if ((int)uVar30 < 0) {
      uVar33 = uVar23;
    }
    if (((int)uVar33 < 0) || (iVar21 <= (int)uVar33)) goto LAB_00164f58;
  }
  pIVar31 = pIVar31 + uVar33;
  (pIVar5->DC).CursorPos = local_a0;
  fVar44 = (tab_bar->BarRect).Max.x - ((float)local_88._0_4_ + 1.0);
  (tab_bar->BarRect).Max.x = fVar44;
  IVar28 = pIVar31->ID;
  if ((pIVar31->Flags & 0x200000) == 0) {
    tab_bar->SelectedTabId = IVar28;
  }
LAB_0016492e:
  fVar41 = local_f8[1] + fVar40 + uStack_e0._4_4_ + 0.0;
  fVar44 = fVar44 - (tab_bar->BarRect).Min.x;
  if (fVar41 < fVar44) {
    fVar42 = ((float)local_e8 + local_114) -
             ((fVar44 - (local_f8[1] + fVar40)) - (uStack_e0._4_4_ + 0.0));
    if (0.0 <= fVar42) goto LAB_00164986;
  }
  else {
    fVar42 = fVar41 - fVar44;
LAB_00164986:
    if ((0.0 < fVar42) && ((fVar44 <= fVar41 || ((tab_bar->Flags & 0x40U) != 0)))) {
      if (fVar44 <= fVar41) {
        uVar36 = (int)uStack_e0 + (int)fVar43;
      }
      uVar23 = 0;
      if (fVar41 < fVar44) {
        uVar23 = (int)uStack_e0 + (int)fVar43;
      }
      ShrinkWidths((pIVar16->ShrinkWidthBuffer).Data + (int)uVar23,uVar36,fVar42);
      if (0 < (int)uVar36) {
        uVar32 = (ulong)uVar23;
        do {
          if (((int)uVar23 < 0) || ((pIVar16->ShrinkWidthBuffer).Size <= (int)uVar32))
          goto LAB_00164f77;
          pIVar7 = (pIVar16->ShrinkWidthBuffer).Data;
          iVar29 = pIVar7[uVar32].Index;
          lVar25 = (long)iVar29;
          if ((lVar25 < 0) || ((tab_bar->Tabs).Size <= iVar29)) goto LAB_00164f58;
          iVar29 = (int)pIVar7[uVar32].Width;
          if (-1 < iVar29) {
            fVar41 = (float)iVar29;
            pIVar31 = (tab_bar->Tabs).Data;
            lVar39 = (ulong)((char)pIVar31[lVar25].Flags < '\0') + 1;
            if ((pIVar31[lVar25].Flags & 0x40U) != 0) {
              lVar39 = 0;
            }
            local_f8[lVar39 * 3 + 1] = local_f8[lVar39 * 3 + 1] - (pIVar31[lVar25].Width - fVar41);
            pIVar31[lVar25].Width = fVar41;
          }
          uVar32 = uVar32 + 1;
        } while ((int)uVar32 < (int)(uVar36 + uVar23));
      }
    }
  }
  tab_bar->WidthAllTabs = 0.0;
  lVar25 = 0;
  fVar44 = 0.0;
  fVar41 = 0.0;
  uVar36 = 0;
  do {
    fVar42 = fVar41;
    if ((lVar25 == 2) &&
       (fVar42 = ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - local_f8[7],
       fVar42 = (float)(~-(uint)(fVar42 <= 0.0) & (uint)fVar42), fVar41 <= fVar42)) {
      fVar42 = fVar41;
    }
    fVar45 = local_f8[lVar25 * 3];
    if (0 < (long)(int)fVar45) {
      lVar39 = (ulong)uVar36 * 0x24 + 0x14;
      uVar32 = 0;
      do {
        if (((int)uVar36 < 0) || ((tab_bar->Tabs).Size <= (int)(uVar36 + (int)uVar32)))
        goto LAB_00164f58;
        pIVar31 = (tab_bar->Tabs).Data;
        *(float *)((long)pIVar31 + lVar39 + -4) = fVar42;
        fVar41 = 0.0;
        if (uVar32 < (int)fVar45 - 1) {
          fVar41 = (pIVar16->Style).ItemInnerSpacing.x;
        }
        fVar42 = fVar42 + fVar41 + *(float *)((long)&pIVar31->ID + lVar39);
        uVar32 = uVar32 + 1;
        lVar39 = lVar39 + 0x24;
      } while ((long)(int)fVar45 != uVar32);
    }
    fVar41 = local_f8[lVar25 * 3 + 2];
    fVar49 = local_f8[lVar25 * 3 + 1] + fVar41;
    fVar44 = fVar44 + (float)(-(uint)(0.0 <= fVar49) & (uint)fVar49);
    tab_bar->WidthAllTabs = fVar44;
    fVar41 = fVar42 + fVar41;
    uVar36 = (int)fVar45 + uVar36;
    lVar25 = lVar25 + 1;
  } while (lVar25 != 3);
  if (bVar18) {
    tab_bar->SelectedTabId = 0;
  }
  else {
    IVar22 = tab_bar->SelectedTabId;
    if (IVar22 != 0) goto LAB_00164b8b;
  }
  IVar22 = 0;
  if ((tab_bar->NextSelectedTabId == 0) && (IVar22 = 0, local_120 != (ImGuiID *)0x0)) {
    IVar22 = *local_120;
    tab_bar->SelectedTabId = IVar22;
    IVar28 = IVar22;
  }
LAB_00164b8b:
  tab_bar->VisibleTabId = IVar22;
  tab_bar->VisibleTabWasSubmitted = false;
  if ((IVar28 != 0) && (lVar25 = (long)(tab_bar->Tabs).Size, 0 < lVar25)) {
    pIVar31 = (tab_bar->Tabs).Data;
    do {
      if (pIVar31->ID == IVar28) {
        if ((pIVar31->Flags & 0xc0) != 0) break;
        fVar41 = GImGui->FontSize;
        iVar29 = ImGuiTabBar::GetTabOrder(tab_bar,pIVar31);
        fVar44 = (tab_bar->BarRect).Max.x;
        fVar42 = (tab_bar->BarRect).Min.x;
        fVar49 = pIVar31->Offset - local_f8[1];
        fVar45 = fVar41;
        if (iVar29 < (int)fVar43) {
          fVar45 = -0.0;
        }
        fVar45 = fVar49 - fVar45;
        if ((tab_bar->Tabs).Size - (int)uStack_e0 <= iVar29 + 1) {
          fVar41 = 1.0;
        }
        fVar41 = fVar49 + pIVar31->Width + fVar41;
        tab_bar->ScrollingTargetDistToVisibility = 0.0;
        if ((fVar45 < tab_bar->ScrollingTarget) ||
           (fVar43 = (((fVar44 - fVar42) - local_f8[1]) - uStack_e0._4_4_) - local_114,
           fVar43 <= fVar41 - fVar45)) {
          fVar44 = tab_bar->ScrollingAnim - fVar41;
        }
        else {
          if (fVar41 - fVar43 <= tab_bar->ScrollingTarget) break;
          fVar44 = (fVar45 - fVar43) - tab_bar->ScrollingAnim;
          fVar45 = fVar41 - fVar43;
        }
        tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar44) & (uint)fVar44);
        tab_bar->ScrollingTarget = fVar45;
        break;
      }
      pIVar31 = pIVar31 + 1;
      lVar25 = lVar25 + -1;
    } while (lVar25 != 0);
  }
  fVar43 = (tab_bar->BarRect).Min.x;
  fVar41 = (tab_bar->BarRect).Max.x;
  auVar46._0_4_ = tab_bar->WidthAllTabs - (fVar41 - fVar43);
  uVar2 = tab_bar->ScrollingAnim;
  uVar4 = tab_bar->ScrollingTarget;
  auVar47._4_4_ = uVar4;
  auVar47._0_4_ = uVar2;
  auVar47._8_8_ = 0;
  auVar46._4_4_ = auVar46._0_4_;
  auVar46._8_4_ = auVar46._0_4_;
  auVar46._12_4_ = auVar46._0_4_;
  auVar48 = minps(auVar47,auVar46);
  fVar44 = (float)(-(uint)(0.0 <= auVar48._0_4_) & (uint)auVar48._0_4_);
  fVar42 = (float)(-(uint)(0.0 <= auVar48._4_4_) & (uint)auVar48._4_4_);
  tab_bar->ScrollingAnim = fVar44;
  tab_bar->ScrollingTarget = fVar42;
  if ((fVar44 != fVar42) || (NAN(fVar44) || NAN(fVar42))) {
    fVar45 = pIVar16->FontSize;
    fVar49 = fVar45 * 70.0;
    uVar36 = -(uint)(fVar49 <= tab_bar->ScrollingSpeed);
    fVar50 = ABS(fVar42 - fVar44) / 0.3;
    fVar49 = (float)(~uVar36 & (uint)fVar49 | (uint)tab_bar->ScrollingSpeed & uVar36);
    uVar36 = -(uint)(fVar50 <= fVar49);
    fVar50 = (float)(~uVar36 & (uint)fVar50 | uVar36 & (uint)fVar49);
    tab_bar->ScrollingSpeed = fVar50;
    fVar49 = fVar42;
    if ((pIVar16->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar45 * 10.0)) {
      fVar50 = fVar50 * (pIVar16->IO).DeltaTime;
      if (fVar42 <= fVar44) {
        fVar49 = fVar44;
        if (fVar42 < fVar44) {
          fVar44 = fVar44 - fVar50;
          uVar36 = -(uint)(fVar42 <= fVar44);
          fVar49 = (float)((uint)fVar44 & uVar36 | ~uVar36 & (uint)fVar42);
        }
      }
      else {
        fVar49 = fVar44 + fVar50;
        if (fVar42 <= fVar49) {
          fVar49 = fVar42;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar49;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  tab_bar->ScrollingRectMinX = fVar40 + fVar43 + local_f8[1];
  tab_bar->ScrollingRectMaxX = (fVar41 - uStack_e0._4_4_) - local_114;
  if ((tab_bar->Flags & 0x100000) == 0) {
    if ((tab_bar->TabsNames).Buf.Capacity < 0) {
      __dest_01 = (char *)MemAlloc(0);
      pcVar27 = (tab_bar->TabsNames).Buf.Data;
      if (pcVar27 != (char *)0x0) {
        memcpy(__dest_01,pcVar27,(long)(tab_bar->TabsNames).Buf.Size);
        MemFree((tab_bar->TabsNames).Buf.Data);
      }
      (tab_bar->TabsNames).Buf.Data = __dest_01;
      (tab_bar->TabsNames).Buf.Capacity = 0;
    }
    (tab_bar->TabsNames).Buf.Size = 0;
  }
  pIVar5 = pIVar16->CurrentWindow;
  (pIVar5->DC).CursorPos = (tab_bar->BarRect).Min;
  IVar6 = (tab_bar->BarRect).Min;
  IVar3 = (tab_bar->BarRect).Max;
  local_58.y = IVar3.y - IVar6.y;
  local_58.x = IVar3.x - IVar6.x;
  ItemSize((ImVec2 *)&local_58,(tab_bar->FramePadding).y);
  fVar43 = (tab_bar->BarRect).Min.x + tab_bar->WidthAllTabsIdeal;
  fVar40 = (pIVar5->DC).IdealMaxPos.x;
  uVar36 = -(uint)(fVar43 <= fVar40);
  (pIVar5->DC).IdealMaxPos.x = (float)(uVar36 & (uint)fVar40 | ~uVar36 & (uint)fVar43);
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect by compacting list
    // Detect if we need to sort out tab list (e.g. in rare case where a tab changed section)
    int tab_dst_n = 0;
    bool need_sort_by_section = false;
    ImGuiTabBarSection sections[3]; // Layout sections: Leading, Central, Trailing
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible || tab->WantClose)
        {
            // Remove tab
            if (tab_bar->VisibleTabId == tab->ID) { tab_bar->VisibleTabId = 0; }
            if (tab_bar->SelectedTabId == tab->ID) { tab_bar->SelectedTabId = 0; }
            if (tab_bar->NextSelectedTabId == tab->ID) { tab_bar->NextSelectedTabId = 0; }
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];

        tab = &tab_bar->Tabs[tab_dst_n];
        tab->IndexDuringLayout = (ImS16)tab_dst_n;

        // We will need sorting if tabs have changed section (e.g. moved from one of Leading/Central/Trailing to another)
        int curr_tab_section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
        if (tab_dst_n > 0)
        {
            ImGuiTabItem* prev_tab = &tab_bar->Tabs[tab_dst_n - 1];
            int prev_tab_section_n = (prev_tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (prev_tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
            if (curr_tab_section_n == 0 && prev_tab_section_n != 0)
                need_sort_by_section = true;
            if (prev_tab_section_n == 2 && curr_tab_section_n != 2)
                need_sort_by_section = true;
        }

        sections[curr_tab_section_n].TabCount++;
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    if (need_sort_by_section)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerBySection);

    // Calculate spacing between sections
    sections[0].Spacing = sections[0].TabCount > 0 && (sections[1].TabCount + sections[2].TabCount) > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;
    sections[1].Spacing = sections[1].TabCount > 0 && sections[2].TabCount > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (TabBarProcessReorder(tab_bar))
            if (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)
                scroll_track_selected_tab_id = tab_bar->ReorderRequestTabId;
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Min.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Leading/Trailing tabs will be shrink only if central one aren't visible anymore, so layout the shrink data as: leading, trailing, central
    // (whereas our tabs are stored as: leading, central, trailing)
    int shrink_buffer_indexes[3] = { 0, sections[0].TabCount + sections[2].TabCount, sections[0].TabCount };
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);

    // Compute ideal tabs widths + store them into shrink buffer
    ImGuiTabItem* most_recently_selected_tab = NULL;
    int curr_section_n = -1;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if ((most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected) && !(tab->Flags & ImGuiTabItemFlags_Button))
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) ? false : true;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        int section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
        ImGuiTabBarSection* section = &sections[section_n];
        section->Width += tab->ContentWidth + (section_n == curr_section_n ? g.Style.ItemInnerSpacing.x : 0.0f);
        curr_section_n = section_n;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        int shrink_buffer_index = shrink_buffer_indexes[section_n]++;
        g.ShrinkWidthBuffer[shrink_buffer_index].Index = tab_n;
        g.ShrinkWidthBuffer[shrink_buffer_index].Width = tab->ContentWidth;

        IM_ASSERT(tab->ContentWidth > 0.0f);
        tab->Width = tab->ContentWidth;
    }

    // Compute total ideal width (used for e.g. auto-resizing a window)
    tab_bar->WidthAllTabsIdeal = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
        tab_bar->WidthAllTabsIdeal += sections[section_n].Width + sections[section_n].Spacing;

    // Horizontal scrolling buttons
    // (note that TabBarScrollButtons() will alter BarRect.Max.x)
    if ((tab_bar->WidthAllTabsIdeal > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll))
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarScrollingButtons(tab_bar))
        {
            scroll_track_selected_tab_id = scroll_track_selected_tab->ID;
            if (!(scroll_track_selected_tab->Flags & ImGuiTabItemFlags_Button))
                tab_bar->SelectedTabId = scroll_track_selected_tab_id;
        }

    // Shrink widths if full tabs don't fit in their allocated space
    float section_0_w = sections[0].Width + sections[0].Spacing;
    float section_1_w = sections[1].Width + sections[1].Spacing;
    float section_2_w = sections[2].Width + sections[2].Spacing;
    bool central_section_is_visible = (section_0_w + section_2_w) < tab_bar->BarRect.GetWidth();
    float width_excess;
    if (central_section_is_visible)
        width_excess = ImMax(section_1_w - (tab_bar->BarRect.GetWidth() - section_0_w - section_2_w), 0.0f); // Excess used to shrink central section
    else
        width_excess = (section_0_w + section_2_w) - tab_bar->BarRect.GetWidth(); // Excess used to shrink leading/trailing section

    // With ImGuiTabBarFlags_FittingPolicyScroll policy, we will only shrink leading/trailing if the central section is not visible anymore
    if (width_excess > 0.0f && ((tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown) || !central_section_is_visible))
    {
        int shrink_data_count = (central_section_is_visible ? sections[1].TabCount : sections[0].TabCount + sections[2].TabCount);
        int shrink_data_offset = (central_section_is_visible ? sections[0].TabCount + sections[2].TabCount : 0);
        ShrinkWidths(g.ShrinkWidthBuffer.Data + shrink_data_offset, shrink_data_count, width_excess);

        // Apply shrunk values into tabs and sections
        for (int tab_n = shrink_data_offset; tab_n < shrink_data_offset + shrink_data_count; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index];
            float shrinked_width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
            if (shrinked_width < 0.0f)
                continue;

            int section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
            sections[section_n].Width -= (tab->Width - shrinked_width);
            tab->Width = shrinked_width;
        }
    }

    // Layout all active tabs
    int section_tab_index = 0;
    float tab_offset = 0.0f;
    tab_bar->WidthAllTabs = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
    {
        ImGuiTabBarSection* section = &sections[section_n];
        if (section_n == 2)
            tab_offset = ImMin(ImMax(0.0f, tab_bar->BarRect.GetWidth() - section->Width), tab_offset);

        for (int tab_n = 0; tab_n < section->TabCount; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[section_tab_index + tab_n];
            tab->Offset = tab_offset;
            tab_offset += tab->Width + (tab_n < section->TabCount - 1 ? g.Style.ItemInnerSpacing.x : 0.0f);
        }
        tab_bar->WidthAllTabs += ImMax(section->Width + section->Spacing, 0.0f);
        tab_offset += section->Spacing;
        section_tab_index += section->TabCount;
    }

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab, sections);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }
    tab_bar->ScrollingRectMinX = tab_bar->BarRect.Min.x + sections[0].Width + sections[0].Spacing;
    tab_bar->ScrollingRectMaxX = tab_bar->BarRect.Max.x - sections[2].Width - sections[1].Spacing;

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);

    // Actual layout in host window (we don't do it in BeginTabBar() so as not to waste an extra frame)
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.CursorPos = tab_bar->BarRect.Min;
    ItemSize(tab_bar->BarRect.GetSize(), tab_bar->FramePadding.y);
    window->DC.IdealMaxPos.x = ImMax(window->DC.IdealMaxPos.x, tab_bar->BarRect.Min.x + tab_bar->WidthAllTabsIdeal);
}